

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O3

int __thiscall CaDiCaL::Internal::negative_horn_satisfiable(Internal *this)

{
  anon_struct_8_2_4505284c_for_terminate *paVar1;
  int64_t *piVar2;
  int iVar3;
  pointer ppCVar4;
  Terminator *pTVar5;
  Clause *pCVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  Clause *__range2;
  long lVar10;
  int idx;
  int lit;
  pointer ppCVar11;
  
  ppCVar4 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar11 = (this->clauses).
                  super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppCVar11 != ppCVar4; ppCVar11 = ppCVar11 + 1) {
    if (this->termination_forced != false) goto LAB_0081c1a4;
    iVar9 = (this->lim).terminate.forced;
    if ((iVar9 != 0) && ((this->lim).terminate.forced = iVar9 + -1, iVar9 == 1)) goto LAB_0081c19d;
    pTVar5 = this->external->terminator;
    if (pTVar5 != (Terminator *)0x0) {
      paVar1 = &(this->lim).terminate;
      iVar9 = paVar1->check;
      paVar1->check = paVar1->check + -1;
      if (iVar9 == 0) {
        (this->lim).terminate.check = (this->opts).terminateint * 10;
        cVar7 = (**(code **)(*(long *)pTVar5 + 0x10))();
        if (cVar7 != '\0') goto LAB_0081c19d;
      }
    }
    pCVar6 = *ppCVar11;
    if ((*(ushort *)&pCVar6->field_0x8 & 0x810) == 0) {
      if ((long)pCVar6->size == 0) {
LAB_0081c173:
        if (this->level < 1) goto LAB_0081c199;
        backtrack(this,0);
        goto LAB_0081c186;
      }
      lVar10 = 0;
      while( true ) {
        iVar9 = *(int *)((long)&pCVar6[1].field_0 + lVar10);
        if ('\0' < this->vals[iVar9]) break;
        if (iVar9 < 1 && this->vals[iVar9] == '\0') {
          if (iVar9 == 0) goto LAB_0081c173;
          search_assume_decision(this,iVar9);
          bVar8 = propagate(this);
          if (!bVar8) goto LAB_0081c186;
          break;
        }
        lVar10 = lVar10 + 4;
        if ((long)pCVar6->size * 4 == lVar10) goto LAB_0081c173;
      }
    }
  }
  iVar9 = *(this->vars).n;
  if (iVar9 != 0) {
    lit = 1;
    do {
      if (this->termination_forced != false) goto LAB_0081c1a4;
      iVar3 = (this->lim).terminate.forced;
      if ((iVar3 != 0) && ((this->lim).terminate.forced = iVar3 + -1, iVar3 == 1))
      goto LAB_0081c19d;
      pTVar5 = this->external->terminator;
      if (pTVar5 != (Terminator *)0x0) {
        paVar1 = &(this->lim).terminate;
        iVar3 = paVar1->check;
        paVar1->check = paVar1->check + -1;
        if (iVar3 == 0) {
          (this->lim).terminate.check = (this->opts).terminateint * 10;
          cVar7 = (**(code **)(*(long *)pTVar5 + 0x10))();
          if (cVar7 != '\0') goto LAB_0081c19d;
        }
      }
      if (this->vals[lit] == '\0') {
        search_assume_decision(this,lit);
        bVar8 = propagate(this);
        if (!bVar8) goto LAB_0081c186;
      }
      bVar8 = lit != iVar9;
      lit = lit + 1;
    } while (bVar8);
  }
  if (this->internal != (Internal *)0x0) {
    verbose(this->internal,1,"clauses are negative horn satisfied");
  }
  piVar2 = &(this->stats).lucky.horn.negative;
  *piVar2 = *piVar2 + 1;
  return 10;
LAB_0081c186:
  if (0 < this->level) {
    backtrack(this,0);
  }
LAB_0081c199:
  iVar9 = 0;
  goto LAB_0081c1bc;
LAB_0081c19d:
  this->termination_forced = true;
LAB_0081c1a4:
  if (0 < this->level) {
    backtrack(this,0);
  }
  iVar9 = -1;
LAB_0081c1bc:
  if (this->conflict != (Clause *)0x0) {
    this->conflict = (Clause *)0x0;
  }
  return iVar9;
}

Assistant:

int Internal::negative_horn_satisfiable () {
  LOG ("checking that all clauses are negative horn satisfiable");
  assert (!level);
  assert (assumptions.empty ());
  for (const auto &c : clauses) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (c->garbage)
      continue;
    if (c->redundant)
      continue;
    int negative_literal = 0;
    bool satisfied = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0) {
        satisfied = true;
        break;
      }
      if (tmp < 0)
        continue;
      if (lit > 0)
        continue;
      negative_literal = lit;
      break;
    }
    if (satisfied)
      continue;
    if (!negative_literal) {
      if (level > 0)
        backtrack ();
      LOG (c, "no negative unassigned literal in");
      return unlucky (0);
    }
    assert (negative_literal < 0);
    LOG (c, "found negative literal %d in", negative_literal);
    search_assume_decision (negative_literal);
    if (propagate ())
      continue;
    LOG ("propagation of negative literal %d leads to conflict",
         negative_literal);
    return unlucky (0);
  }
  for (auto idx : vars) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (propagate ())
      continue;
    LOG ("propagation of remaining literal %d leads to conflict", idx);
    return unlucky (0);
  }
  VERBOSE (1, "clauses are negative horn satisfied");
  assert (!conflict);
  assert (satisfied ());
  stats.lucky.horn.negative++;
  return 10;
}